

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_OStream.cc
# Opt level: O3

void __thiscall Pl_OStream::Pl_OStream(Pl_OStream *this,char *identifier,ostream *os)

{
  Members *pMVar1;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,(Pipeline *)0x0);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_OStream_002ea640;
  pMVar1 = (Members *)operator_new(8);
  pMVar1->os = os;
  (this->m)._M_t.
  super___uniq_ptr_impl<Pl_OStream::Members,_std::default_delete<Pl_OStream::Members>_>._M_t.
  super__Tuple_impl<0UL,_Pl_OStream::Members_*,_std::default_delete<Pl_OStream::Members>_>.
  super__Head_base<0UL,_Pl_OStream::Members_*,_false>._M_head_impl = pMVar1;
  return;
}

Assistant:

Pl_OStream::Pl_OStream(char const* identifier, std::ostream& os) :
    Pipeline(identifier, nullptr),
    m(std::make_unique<Members>(os))
{
}